

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3DbStrDup(sqlite3 *db,char *z)

{
  void *__dest;
  char *pcVar1;
  uint n;
  long lVar2;
  
  if (z != (char *)0x0) {
    lVar2 = 0;
    do {
      pcVar1 = z + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pcVar1 != '\0');
    n = ((int)lVar2 - 1U & 0x3fffffff) + 1;
    __dest = sqlite3DbMallocRaw(db,n);
    if (__dest != (void *)0x0) {
      pcVar1 = (char *)memcpy(__dest,z,(ulong)n);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrDup(sqlite3 *db, const char *z){
  char *zNew;
  size_t n;
  if( z==0 ){
    return 0;
  }
  n = sqlite3Strlen30(z) + 1;
  assert( (n&0x7fffffff)==n );
  zNew = sqlite3DbMallocRaw(db, (int)n);
  if( zNew ){
    memcpy(zNew, z, n);
  }
  return zNew;
}